

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArray2DCloseFailureContainsCorrectDetails::
~TestCheckArray2DCloseFailureContainsCorrectDetails
          (TestCheckArray2DCloseFailureContainsCorrectDetails *this)

{
  TestCheckArray2DCloseFailureContainsCorrectDetails *this_local;
  
  ~TestCheckArray2DCloseFailureContainsCorrectDetails(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArray2DCloseFailureContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails testDetails("array2DCloseTest", "array2DCloseSuite", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);

		int const data1[2][2] = { {0, 1}, {2, 3} };
        int const data2[2][2] = { {0, 1}, {3, 3} };
		CHECK_ARRAY2D_CLOSE (data1, data2, 2, 2, 0.01f);     line = __LINE__;
    }

    CHECK_EQUAL("array2DCloseTest", reporter.lastFailedTest);
    CHECK_EQUAL("array2DCloseSuite", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}